

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_setcond_i32_m68k
               (TCGContext_conflict2 *tcg_ctx,TCGCond cond,TCGv_i32 ret,TCGv_i32 arg1,TCGv_i32 arg2)

{
  TCGv_i32 arg2_local;
  TCGv_i32 arg1_local;
  TCGv_i32 ret_local;
  TCGCond cond_local;
  TCGContext_conflict2 *tcg_ctx_local;
  
  if (cond == TCG_COND_ALWAYS) {
    tcg_gen_movi_i32(tcg_ctx,ret,1);
  }
  else if (cond == TCG_COND_NEVER) {
    tcg_gen_movi_i32(tcg_ctx,ret,0);
  }
  else {
    tcg_gen_op4i_i32(tcg_ctx,INDEX_op_setcond_i32,ret,arg1,arg2,(ulong)cond);
  }
  return;
}

Assistant:

void tcg_gen_setcond_i32(TCGContext *tcg_ctx, TCGCond cond, TCGv_i32 ret,
                         TCGv_i32 arg1, TCGv_i32 arg2)
{
    if (cond == TCG_COND_ALWAYS) {
        tcg_gen_movi_i32(tcg_ctx, ret, 1);
    } else if (cond == TCG_COND_NEVER) {
        tcg_gen_movi_i32(tcg_ctx, ret, 0);
    } else {
        tcg_gen_op4i_i32(tcg_ctx, INDEX_op_setcond_i32, ret, arg1, arg2, cond);
    }
}